

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnReader::DecompressInternal
          (ColumnReader *this,type codec,const_data_ptr_t src,idx_t src_size,data_ptr_t dst,
          idx_t dst_size)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  BrotliDecoderResult BVar5;
  size_t code;
  BrotliDecoderStateInternal *s;
  InternalException *this_00;
  runtime_error *prVar6;
  type codec_local;
  data_ptr_t dst_local;
  const_data_ptr_t src_local;
  unsigned_long src_size_size_t;
  unsigned_long dst_size_size_t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  size_t uncompressed_size;
  size_type sStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined8 local_198;
  mz_ulong mStack_190;
  char *local_188;
  mz_internal_state *pmStack_180;
  mz_alloc_func local_178;
  mz_free_func p_Stack_170;
  void *local_168;
  undefined8 uStack_160;
  mz_ulong local_158;
  mz_ulong mStack_150;
  MiniZStreamType local_148;
  
  codec_local = codec;
  dst_local = dst;
  src_local = src;
  switch(codec) {
  case UNCOMPRESSED:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&uncompressed_size,"Parquet data unexpectedly uncompressed",
               (allocator *)&src_size_size_t);
    InternalException::InternalException(this_00,(string *)&uncompressed_size);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case SNAPPY:
    uncompressed_size = 0;
    bVar1 = duckdb_snappy::GetUncompressedLength((char *)src,src_size,&uncompressed_size);
    if (bVar1) {
      if (uncompressed_size == dst_size) {
        bVar1 = duckdb_snappy::RawUncompress((char *)src,src_size,(char *)dst);
        if (bVar1) {
          return;
        }
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error(prVar6,"Snappy decompression failure");
      }
      else {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar6,"Snappy decompression failure: Uncompressed data size mismatch");
      }
    }
    else {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar6,"Snappy decompression failure");
    }
    break;
  case GZIP:
    local_158 = 0;
    mStack_150 = 0;
    local_168 = (void *)0x0;
    uStack_160._0_4_ = 0;
    uStack_160._4_4_ = 0;
    local_178 = (mz_alloc_func)0x0;
    p_Stack_170 = (mz_free_func)0x0;
    local_188 = (char *)0x0;
    pmStack_180 = (mz_internal_state *)0x0;
    local_198._0_4_ = 0;
    local_198._4_4_ = 0;
    mStack_190 = 0;
    local_1a8._M_allocated_capacity = 0;
    local_1a8._8_8_ = (uchar *)0x0;
    uncompressed_size = 0;
    sStack_1b0 = 0;
    local_148 = MINIZ_TYPE_NONE;
    MiniZStream::Decompress
              ((MiniZStream *)&uncompressed_size,(char *)src,src_size,(char *)dst,dst_size);
    MiniZStream::~MiniZStream((MiniZStream *)&uncompressed_size);
    return;
  default:
    ::std::__cxx11::stringstream::stringstream((stringstream *)&uncompressed_size);
    duckdb_parquet::operator<<((ostream *)local_1a8._M_local_buf,&codec_local);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::stringbuf::str();
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &dst_size_size_t,"Unsupported compression codec \"",&local_1d8);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &src_size_size_t,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &dst_size_size_t,
                     "\". Supported options are uncompressed, brotli, gzip, lz4_raw, snappy or zstd"
                    );
    ::std::runtime_error::runtime_error(prVar6,(string *)&src_size_size_t);
    __cxa_throw(prVar6,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  case BROTLI:
    s = duckdb_brotli::BrotliDecoderCreateInstance
                  ((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
    uncompressed_size = 0;
    src_size_size_t = src_size;
    dst_size_size_t = dst_size;
    BVar5 = duckdb_brotli::BrotliDecoderDecompressStream
                      (s,&src_size_size_t,&src_local,&dst_size_size_t,&dst_local,&uncompressed_size)
    ;
    if (BVar5 == BROTLI_DECODER_RESULT_SUCCESS) {
      duckdb_brotli::BrotliDecoderDestroyInstance(s);
      return;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar6,"Brotli Decompression failure");
    break;
  case ZSTD:
    code = duckdb_zstd::ZSTD_decompress(dst,dst_size,src,src_size);
    uVar4 = duckdb_zstd::ZSTD_isError(code);
    if ((code == dst_size) && (uVar4 == 0)) {
      return;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar6,"ZSTD Decompression failure");
    break;
  case LZ4_RAW:
    iVar2 = duckdb_lz4::LZ4_decompress_safe((char *)src,(char *)dst,(int)src_size,(int)dst_size);
    iVar3 = NumericCastImpl<int,_unsigned_long,_false>::Convert(dst_size);
    if (iVar2 == iVar3) {
      return;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar6,"LZ4 decompression failure");
  }
  __cxa_throw(prVar6,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ColumnReader::DecompressInternal(CompressionCodec::type codec, const_data_ptr_t src, idx_t src_size,
                                      data_ptr_t dst, idx_t dst_size) {
	switch (codec) {
	case CompressionCodec::UNCOMPRESSED:
		throw InternalException("Parquet data unexpectedly uncompressed");
	case CompressionCodec::GZIP: {
		MiniZStream s;
		s.Decompress(const_char_ptr_cast(src), src_size, char_ptr_cast(dst), dst_size);
		break;
	}
	case CompressionCodec::LZ4_RAW: {
		auto res =
		    duckdb_lz4::LZ4_decompress_safe(const_char_ptr_cast(src), char_ptr_cast(dst),
		                                    UnsafeNumericCast<int32_t>(src_size), UnsafeNumericCast<int32_t>(dst_size));
		if (res != NumericCast<int>(dst_size)) {
			throw std::runtime_error("LZ4 decompression failure");
		}
		break;
	}
	case CompressionCodec::SNAPPY: {
		{
			size_t uncompressed_size = 0;
			auto res = duckdb_snappy::GetUncompressedLength(const_char_ptr_cast(src), src_size, &uncompressed_size);
			if (!res) {
				throw std::runtime_error("Snappy decompression failure");
			}
			if (uncompressed_size != dst_size) {
				throw std::runtime_error("Snappy decompression failure: Uncompressed data size mismatch");
			}
		}
		auto res = duckdb_snappy::RawUncompress(const_char_ptr_cast(src), src_size, char_ptr_cast(dst));
		if (!res) {
			throw std::runtime_error("Snappy decompression failure");
		}
		break;
	}
	case CompressionCodec::ZSTD: {
		auto res = duckdb_zstd::ZSTD_decompress(dst, dst_size, src, src_size);
		if (duckdb_zstd::ZSTD_isError(res) || res != dst_size) {
			throw std::runtime_error("ZSTD Decompression failure");
		}
		break;
	}
	case CompressionCodec::BROTLI: {
		auto state = duckdb_brotli::BrotliDecoderCreateInstance(nullptr, nullptr, nullptr);
		size_t total_out = 0;
		auto src_size_size_t = NumericCast<size_t>(src_size);
		auto dst_size_size_t = NumericCast<size_t>(dst_size);

		auto res = duckdb_brotli::BrotliDecoderDecompressStream(state, &src_size_size_t, &src, &dst_size_size_t, &dst,
		                                                        &total_out);
		if (res != duckdb_brotli::BROTLI_DECODER_RESULT_SUCCESS) {
			throw std::runtime_error("Brotli Decompression failure");
		}
		duckdb_brotli::BrotliDecoderDestroyInstance(state);
		break;
	}

	default: {
		std::stringstream codec_name;
		codec_name << codec;
		throw std::runtime_error("Unsupported compression codec \"" + codec_name.str() +
		                         "\". Supported options are uncompressed, brotli, gzip, lz4_raw, snappy or zstd");
	}
	}
}